

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

void whisper_kv_cache_seq_cp
               (whisper_kv_cache *cache,whisper_seq_id seq_id_src,whisper_seq_id seq_id_dst,
               whisper_pos p0,whisper_pos p1)

{
  pointer pwVar1;
  bool bVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  whisper_seq_id local_30;
  whisper_seq_id local_2c;
  
  cache->head = 0;
  lVar3 = 0;
  local_30 = seq_id_dst;
  local_2c = seq_id_src;
  for (uVar4 = 0; uVar4 < cache->size; uVar4 = uVar4 + 1) {
    bVar2 = whisper_kv_cell::has_seq_id
                      ((whisper_kv_cell *)
                       ((long)&((cache->cells).
                                super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pos + lVar3),&local_2c);
    if ((bVar2) &&
       (pwVar1 = (cache->cells).
                 super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>._M_impl.
                 super__Vector_impl_data._M_start,
       *(uint *)((long)&pwVar1->pos + lVar3) < 0x7fffffff)) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((long)&(pwVar1->seq_id)._M_t._M_impl + lVar3),&local_30);
    }
    lVar3 = lVar3 + 0x38;
  }
  return;
}

Assistant:

static void whisper_kv_cache_seq_cp(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id_src,
                 whisper_seq_id   seq_id_dst,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    cache.head = 0;

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].has_seq_id(seq_id_src) && cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            cache.cells[i].seq_id.insert(seq_id_dst);
        }
    }
}